

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

Benchmark * __thiscall
benchmark::internal::Benchmark::Args(Benchmark *this,vector<int,_std::allocator<int>_> *args)

{
  int iVar1;
  size_type sVar2;
  vector<int,_std::allocator<int>_> *in_RSI;
  Benchmark *in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  byte bVar3;
  vector<int,_std::allocator<int>_> local_18;
  
  local_18.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)in_RSI;
  iVar1 = BenchmarkImp::ArgsCnt
                    ((BenchmarkImp *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  bVar3 = 0;
  if (iVar1 != -1) {
    in_stack_ffffffffffffffc4 =
         BenchmarkImp::ArgsCnt
                   ((BenchmarkImp *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    sVar2 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)
                       local_18.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    if (in_stack_ffffffffffffffc4 != (int)sVar2) {
      in_stack_ffffffffffffffb8 = &local_18;
      CheckHandler::CheckHandler
                ((CheckHandler *)CONCAT17(bVar3,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8
                 ,in_stack_ffffffffffffffd0,(char *)in_RDI,in_stack_ffffffffffffffc4);
      bVar3 = 1;
      CheckHandler::GetLog((CheckHandler *)in_stack_ffffffffffffffb8);
      goto LAB_00167244;
    }
  }
  GetNullLogInstance();
LAB_00167244:
  if ((bVar3 & 1) == 0) {
    BenchmarkImp::Args((BenchmarkImp *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                       ,in_stack_ffffffffffffffb8);
    return in_RDI;
  }
  CheckHandler::~CheckHandler((CheckHandler *)&LAB_00167257);
}

Assistant:

Benchmark* Benchmark::Args(const std::vector<int>& args) {
  CHECK(imp_->ArgsCnt() == -1 || imp_->ArgsCnt() == static_cast<int>(args.size()));
  imp_->Args(args);
  return this;
}